

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

size_t ecpIsSafeGroup_deep(size_t n)

{
  size_t sVar1;
  size_t n_00;
  size_t sVar2;
  size_t in_RDI;
  size_t n1;
  
  sVar1 = priIsPrime_deep(0x175c12);
  n_00 = zzMod_deep(in_RDI,in_RDI + 1);
  sVar2 = zzMulMod_deep(n_00);
  sVar1 = utilMax(3,sVar1,n_00,sVar2);
  return (in_RDI + 1) * 0x10 + sVar1;
}

Assistant:

size_t ecpIsSafeGroup_deep(size_t n)
{
	const size_t n1 = n + 1;
	return O_OF_W(2 * n1) +
		utilMax(3,
			priIsPrime_deep(n1),
			zzMod_deep(n, n1),
			zzMulMod_deep(n1));
}